

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

MPP_RET mpp_enc_refs_set_refresh_length(MppEncRefs refs,RK_S32 len)

{
  MppEncRefsImpl *p;
  MPP_RET ret;
  RK_S32 len_local;
  MppEncRefs refs_local;
  
  p._0_4_ = MPP_OK;
  if (refs == (MppEncRefs)0x0) {
    _mpp_log_l(2,"mpp_enc_refs","invalid NULL input refs\n","mpp_enc_refs_set_refresh_length");
    refs_local._4_4_ = MPP_ERR_VALUE;
  }
  else {
    if ((enc_refs_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","enter %p\n","mpp_enc_refs_set_refresh_length",refs);
    }
    if (len < *(int *)((long)refs + 0x30)) {
      *(RK_S32 *)((long)refs + 0x34) = len;
      if ((enc_refs_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_enc_refs","leave %p\n","mpp_enc_refs_set_refresh_length",refs);
      }
    }
    else {
      *(undefined4 *)((long)refs + 0x34) = *(undefined4 *)((long)refs + 0x30);
      p._0_4_ = MPP_ERR_VALUE;
    }
    refs_local._4_4_ = (MPP_RET)p;
  }
  return refs_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_refs_set_refresh_length(MppEncRefs refs, RK_S32 len)
{
    MPP_RET ret = MPP_OK;
    if (NULL == refs) {
        mpp_err_f("invalid NULL input refs\n");
        return MPP_ERR_VALUE;
    }

    enc_refs_dbg_func("enter %p\n", refs);

    MppEncRefsImpl *p = (MppEncRefsImpl *)refs;

    if (len < p->igop) {
        p->refresh_length = len;
    } else {
        p->refresh_length = p->igop;
        ret = MPP_ERR_VALUE;
        goto RET;
    }
    enc_refs_dbg_func("leave %p\n", refs);
RET:
    return ret;
}